

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionTests::initiatorFixtureLookUpSession_InvalidSessionHeader_NoSessionReturnedHelper::
initiatorFixtureLookUpSession_InvalidSessionHeader_NoSessionReturnedHelper
          (initiatorFixtureLookUpSession_InvalidSessionHeader_NoSessionReturnedHelper *this,
          TestDetails *details)

{
  initiatorFixture::initiatorFixture(&this->super_initiatorFixture);
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.super_Responder.
  _vptr_Responder = (_func_int **)&PTR__sessionFixture_0032a3b0;
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.super_NullApplication.
  super_Application._vptr_Application =
       (_func_int **)
       &PTR__initiatorFixtureLookUpSession_InvalidSessionHeader_NoSessionReturnedHelper_0032a408;
  this->m_details = details;
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, LookUpSession_InvalidSessionHeader_NoSessionReturned)
{
  startLoggedOn();
  std::string delimSOH = "\x01";
  std::string header = "8=FIX.4.2" + delimSOH
      + "35=A" + delimSOH //header out of order;
      + "9=100" + delimSOH;

  Session* actualSession = object->lookupSession(header, false);
  CHECK(nullptr == actualSession);
}